

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

void Cbs_ManAssign(Cbs_Man_t *p,Gia_Obj_t *pObj,int Level,Gia_Obj_t *pRes0,Gia_Obj_t *pRes1)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  int local_60;
  int local_50;
  Gia_Obj_t *pObjR;
  Gia_Obj_t *pRes1_local;
  Gia_Obj_t *pRes0_local;
  int Level_local;
  Gia_Obj_t *pObj_local;
  Cbs_Man_t *p_local;
  
  pObj_00 = Gia_Regular(pObj);
  iVar1 = Gia_ObjIsCand(pObj_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1fe,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Cbs_VarIsAssigned(pObj_00);
  if (iVar1 != 0) {
    __assert_fail("!Cbs_VarIsAssigned(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1ff,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  Cbs_VarAssign(pObj_00);
  iVar1 = Gia_IsComplement(pObj);
  Cbs_VarSetValue(pObj_00,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  if (pObj_00->Value != 0xffffffff) {
    __assert_fail("pObjR->Value == ~0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x202,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pObj_00->Value = (p->pProp).iTail;
  Cbs_QuePush(&p->pProp,pObj_00);
  Vec_IntPush(p->vLevReas,Level);
  if (pRes0 == (Gia_Obj_t *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (int)(((long)pRes0 - (long)pObj_00) / 0xc);
  }
  Vec_IntPush(p->vLevReas,local_50);
  if (pRes1 == (Gia_Obj_t *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = (int)(((long)pRes1 - (long)pObj_00) / 0xc);
  }
  Vec_IntPush(p->vLevReas,local_60);
  iVar1 = Vec_IntSize(p->vLevReas);
  if (iVar1 == (p->pProp).iTail * 3) {
    return;
  }
  __assert_fail("Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                ,0x208,"void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline void Cbs_ManAssign( Cbs_Man_t * p, Gia_Obj_t * pObj, int Level, Gia_Obj_t * pRes0, Gia_Obj_t * pRes1 )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs_VarIsAssigned(pObjR) );
    Cbs_VarAssign( pObjR );
    Cbs_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    assert( pObjR->Value == ~0 );
    pObjR->Value = p->pProp.iTail;
    Cbs_QuePush( &p->pProp, pObjR );
    Vec_IntPush( p->vLevReas, Level );
    Vec_IntPush( p->vLevReas, pRes0 ? pRes0-pObjR : 0 );
    Vec_IntPush( p->vLevReas, pRes1 ? pRes1-pObjR : 0 );
    assert( Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail );
//    s_Counter++;
//    s_Counter = Abc_MaxIntInt( s_Counter, Vec_IntSize(p->vLevReas)/3 );
}